

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12CachePolicy.cpp
# Opt level: O1

GMM_STATUS __thiscall GmmLib::GmmGen12CachePolicy::InitCachePolicy(GmmGen12CachePolicy *this)

{
  anon_union_8_2_649915e9_for_GMM_CACHE_POLICY_ELEMENT_REC_1 *paVar1;
  undefined4 uVar2;
  GMM_CACHE_POLICY_ELEMENT *pGVar3;
  undefined4 uVar5;
  long lVar4;
  bool bVar6;
  ushort uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  GMM_CACHE_POLICY_ELEMENT CachePolicyUsage;
  GMM_CACHE_POLICY_ELEMENT *pGVar10;
  uint uVar11;
  ulong uVar12;
  short sVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint32_t Usage;
  long lVar19;
  undefined8 in_stack_ffffffffffffffb0;
  uint64_t local_48;
  uint64_t PTEValue;
  bool local_31 [8];
  bool SpecialMOCS;
  
  pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
           super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
  if (pGVar3 != (GMM_CACHE_POLICY_ELEMENT *)0x0) {
    paVar1 = &pGVar3[1].field_1;
    *(byte *)paVar1 = *(byte *)paVar1 & 0xfe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[1].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[1].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[1].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[1].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[2].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[2].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[2].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[2].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[3].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[3].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[3].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[3].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[4].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[4].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[4].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[4].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[5].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[5].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[5].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[5].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[6].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[6].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[6].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[6].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[7].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[7].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[7].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[7].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[7].field_1.Value = pGVar3[7].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[7].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[7].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[7].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[7].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[8].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[8].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[8].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[8].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[9].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[9].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[9].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[9].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[10].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[10].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[10].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[10].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[10].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[10].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[10].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[10].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[10].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[10].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[10].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[10].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[10].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[10].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[10].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[10].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[10].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[10].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[10].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[10].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[10].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[10].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[10].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[10].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x14].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x14].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x14].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x14].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x14].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x14].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x14].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x14].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x14].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x14].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x14].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x14].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x14].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x14].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x14].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x14].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x14].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x14].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x14].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x14].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x14].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x14].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x14].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x14].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xc].field_1.Value = pGVar3[0xc].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x10].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x10].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x10].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x10].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x10].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x10].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x10].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x10].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x10].field_1.Value =
         (pGVar3[0x10].field_1.Value & 0xffffffffffffdfff) +
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 & 0x400)
         * 8;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x10].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x10].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x10].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x10].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x10].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x10].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x10].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x10].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x10].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x10].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x10].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x10].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x10].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x10].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x10].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x12].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x12].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x12].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x12].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x12].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x12].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x12].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x12].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x12].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x12].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x12].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x12].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x12].field_1.Value = pGVar3[0x12].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x12].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x12].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x12].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x12].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x12].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x12].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x12].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x12].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x12].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x12].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x12].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x13].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x13].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x13].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x13].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x13].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x13].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x13].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x13].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x13].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x13].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x13].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x13].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x13].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x13].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x13].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x13].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x13].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x13].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x13].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x13].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x13].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x13].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x13].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x13].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x15].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x15].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x15].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x15].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x15].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x15].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x15].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x15].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x15].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x15].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x15].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x15].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x15].field_1.Value = pGVar3[0x15].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x15].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x15].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x15].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x15].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x15].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x15].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x15].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x15].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x15].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x15].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x15].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x16].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x16].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x16].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x16].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x16].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x16].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x16].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x16].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x16].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x16].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x16].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x16].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x16].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x16].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x16].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x16].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x16].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x16].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x16].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x16].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x16].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x16].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x16].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x16].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy)->field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy)->field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy)->field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy)->field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy)->field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy)->field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy)->field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy)->field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy)->field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy)->field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy)->field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy)->field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy)->field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy)->field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy)->field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy)->field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy)->field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy)->field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy)->field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy)->field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy)->field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy)->field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy)->field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy)->field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x17].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x17].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x17].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x17].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x17].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x17].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x17].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x17].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x17].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x17].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x17].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x17].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x17].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x17].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x17].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x17].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x17].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x17].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x17].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x17].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x17].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x17].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x17].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x17].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x18].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x18].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x18].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x18].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x18].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x18].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x18].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x18].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x18].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x18].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x18].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x18].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x18].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x18].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x18].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x18].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x18].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x18].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x18].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x18].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x18].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x18].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x18].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x18].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x19].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x19].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x19].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x19].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x19].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x19].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x19].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x19].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x19].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x19].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x19].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x19].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x19].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x19].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x19].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x19].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x19].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x19].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x19].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x19].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x19].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x19].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x19].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x19].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1a].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1a].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1a].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1a].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1b].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1b].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1b].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1b].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1c].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1c].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1c].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1c].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x1c].field_1.Value = pGVar3[0x1c].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1c].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1c].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1c].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1c].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1d].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1d].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1d].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1d].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1d].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1d].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1e].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1e].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1e].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1e].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x1e].field_1.Value = pGVar3[0x1e].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1e].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1e].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1e].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1e].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1f].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1f].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1f].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1f].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x1f].field_1.Value = pGVar3[0x1f].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1f].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1f].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1f].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1f].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x20].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x20].field_1.Value =
         pGVar3[0x20].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x20].field_1;
    paVar1->Value = paVar1->Value | 4;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x20].field_1.Value =
         pGVar3[0x20].field_1.Value & 0xfffffffffffffff7 |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 6 & 8)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x20].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x20].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x20].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x20].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x20].field_1.Value =
         (pGVar3[0x20].field_1.Value & 0xffffffffffffdfff) +
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 & 0x400)
         * 8;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x20].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x20].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x20].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x20].field_1;
    paVar1->Value = paVar1->Value | 0x180000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x20].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x20].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x20].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x20].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x20].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x20].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x20].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x20].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x20].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x20].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x20].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x22].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x22].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x22].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x22].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x22].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x22].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x22].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x22].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x22].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x22].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x22].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x22].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x22].field_1.Value = pGVar3[0x22].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x22].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x22].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x22].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x22].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x22].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x22].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x22].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x22].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x22].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x22].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x22].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x23].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x23].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x23].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x23].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x23].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x23].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x23].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x23].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x23].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x23].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x23].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x23].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x23].field_1.Value = pGVar3[0x23].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x23].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x23].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x23].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x23].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x23].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x23].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x23].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x23].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x23].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x23].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x23].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x24].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x24].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x24].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x24].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x24].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x24].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x24].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x24].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x24].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x24].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x24].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x24].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x24].field_1.Value = pGVar3[0x24].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x24].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x24].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x24].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x24].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x24].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x24].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x24].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x24].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x24].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x24].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x24].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x25].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x25].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x25].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x25].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x25].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x25].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x25].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x25].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x25].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x25].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x25].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x25].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x25].field_1.Value = pGVar3[0x25].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x25].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x25].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x25].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x25].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x25].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x25].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x25].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x25].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x25].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x25].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x25].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x26].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x26].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x26].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x26].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x26].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x26].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x26].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x26].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x26].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x26].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x26].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x26].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x26].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x26].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x26].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x26].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x26].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x26].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x26].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x26].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x26].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x26].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x26].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x26].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x27].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x27].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x27].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x27].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x27].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x27].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x27].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x27].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x27].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x27].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x27].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x27].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x27].field_1.Value = pGVar3[0x27].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x27].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x27].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x27].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x27].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x27].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x27].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x27].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x27].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x27].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x27].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x27].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x28].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x28].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x28].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x28].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x28].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x28].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x28].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x28].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x28].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x28].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x28].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x28].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x28].field_1.Value = pGVar3[0x28].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x28].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x28].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x28].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x28].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x28].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x28].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x28].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x28].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x28].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x28].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x28].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x29].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x29].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x29].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x29].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x29].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x29].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x29].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x29].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x29].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x29].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x29].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x29].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x29].field_1.Value = pGVar3[0x29].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x29].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x29].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x29].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x29].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x29].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x29].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x29].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x29].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x29].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x29].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x29].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2a].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2a].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2a].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2a].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x2a].field_1.Value = pGVar3[0x2a].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2a].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2a].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2a].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2a].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2b].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2b].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2b].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2b].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x2b].field_1.Value = pGVar3[0x2b].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2b].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2b].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2b].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2b].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2c].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2c].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2c].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2c].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x2c].field_1.Value = pGVar3[0x2c].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2c].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2c].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2c].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2c].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2d].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2d].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2d].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2d].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2d].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2d].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2d].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2e].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2e].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2e].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2e].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2f].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2f].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2f].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2f].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x2f].field_1.Value = pGVar3[0x2f].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2f].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2f].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2f].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x2f].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x30].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x30].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x30].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x30].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x30].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x30].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x30].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x30].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x30].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x30].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x30].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x30].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x30].field_1.Value = pGVar3[0x30].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x30].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x30].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x30].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x30].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x30].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x30].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x30].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x30].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x30].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x30].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x30].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x31].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x31].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x31].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x31].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x31].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x31].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x31].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x31].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x31].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x31].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x31].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x31].field_1;
    paVar1->Value = paVar1->Value | 0x40000;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x31].field_1.Value = pGVar3[0x31].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x31].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x31].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x31].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x31].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x31].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x31].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x31].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x31].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x31].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x31].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x31].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x32].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x32].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x32].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x32].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x32].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x32].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x32].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x32].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x32].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x32].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x32].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x32].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x32].field_1.Value = pGVar3[0x32].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x32].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x32].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x32].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x32].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x32].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x32].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x32].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x32].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x32].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x32].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x32].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x33].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x33].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x33].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x33].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x33].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x33].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x33].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x33].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x33].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x33].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x33].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x33].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x33].field_1.Value = pGVar3[0x33].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x33].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x33].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x33].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x33].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x33].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x33].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x33].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x33].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x33].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x33].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x33].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x34].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x34].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x34].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x34].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x34].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x34].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x34].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x34].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x34].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x34].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x34].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x34].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x34].field_1.Value = pGVar3[0x34].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x34].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x34].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x34].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x34].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x34].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x34].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x34].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x34].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x34].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x34].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x34].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x35].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x35].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x35].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x35].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x35].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x35].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x35].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x35].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x35].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x35].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x35].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x35].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x35].field_1.Value = pGVar3[0x35].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x35].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x35].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x35].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x35].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x35].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x35].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x35].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x35].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x35].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x35].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x35].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x36].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x36].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x36].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x36].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x36].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x36].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x36].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x36].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x36].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x36].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x36].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x36].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x36].field_1.Value = pGVar3[0x36].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x36].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x36].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x36].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x36].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x36].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x36].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x36].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x36].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x36].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x36].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x36].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x37].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x37].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x37].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x37].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x37].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x37].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x37].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x37].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x37].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x37].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x37].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x37].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x37].field_1.Value = pGVar3[0x37].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x37].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x37].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x37].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x37].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x37].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x37].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x37].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x37].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x37].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x37].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x37].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x38].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x38].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x38].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x38].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x38].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x38].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x38].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x38].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x38].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x38].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x38].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x38].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x38].field_1.Value = pGVar3[0x38].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x38].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x38].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x38].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x38].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x38].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x38].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x38].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x38].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x38].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x38].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x38].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3d].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3d].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x3d].field_1.Value =
         (pGVar3[0x3d].field_1.Value & 0xffffffffffffdfff) +
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 & 0x400)
         * 8;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x3d].field_1.Value = pGVar3[0x3d].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3d].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3d].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3d].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3d].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x39].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x39].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x39].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x39].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x39].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x39].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x39].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x39].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x39].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x39].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x39].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x39].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x39].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x39].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x39].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x39].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x39].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x39].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x39].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x39].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x39].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x39].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x39].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x39].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3a].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3a].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3a].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x3a].field_1.Value = pGVar3[0x3a].field_1.Value & 0xffffffffffe7ffff | 0x100000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3a].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3a].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3a].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3a].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x3b].field_1.Value =
         pGVar3[0x3b].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3b].field_1;
    paVar1->Value = paVar1->Value | 4;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x3b].field_1.Value =
         pGVar3[0x3b].field_1.Value & 0xfffffffffffffff7 |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 6 & 8)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x3b].field_1.Value =
         (pGVar3[0x3b].field_1.Value & 0xffffffffffffdfff) +
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 & 0x400)
         * 8;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3b].field_1;
    paVar1->Value = paVar1->Value | 0x180000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3b].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3b].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3b].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3b].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3e].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3e].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3e].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3e].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x3e].field_1.Value = pGVar3[0x3e].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3e].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3e].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3e].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3e].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x41].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x41].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x41].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x41].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x41].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x41].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x41].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x41].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x41].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x41].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x41].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x41].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x41].field_1.Value = pGVar3[0x41].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x41].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x41].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x41].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x41].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x41].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x41].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x41].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x41].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x41].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x41].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x41].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x42].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x42].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x42].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x42].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x42].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x42].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x42].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x42].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x42].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x42].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x42].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x42].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x42].field_1.Value = pGVar3[0x42].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x42].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x42].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x42].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x42].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x42].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x42].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x42].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x42].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x42].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x42].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x42].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x43].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x43].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x43].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x43].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x43].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x43].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x43].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x43].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x43].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x43].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x43].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x43].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x43].field_1.Value = pGVar3[0x43].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x43].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x43].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x43].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x43].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x43].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x43].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x43].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x43].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x43].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x43].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x43].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x40].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x40].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x40].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x40].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x40].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x40].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x40].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x40].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x40].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x40].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x40].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x40].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x40].field_1.Value = pGVar3[0x40].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x40].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x40].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x40].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x40].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x40].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x40].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x40].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x40].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x40].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x40].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x40].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x44].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x44].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x44].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x44].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x44].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x44].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x44].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x44].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x44].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x44].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x44].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x44].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x44].field_1.Value = pGVar3[0x44].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x44].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x44].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x44].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x44].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x44].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x44].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x44].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x44].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x44].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x44].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x44].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x45].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x45].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x45].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x45].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x45].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x45].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x45].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x45].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x45].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x45].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x45].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x45].field_1;
    paVar1->Value = paVar1->Value | 0x40000;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x45].field_1.Value = pGVar3[0x45].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x45].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x45].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x45].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x45].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x45].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x45].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x45].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x45].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x45].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x45].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x45].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x46].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x46].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x46].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x46].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x46].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x46].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x46].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x46].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x46].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x46].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x46].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x46].field_1;
    paVar1->Value = paVar1->Value | 0x40000;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x46].field_1.Value = pGVar3[0x46].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x46].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x46].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x46].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x46].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x46].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x46].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x46].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x46].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x46].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x46].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x46].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x47].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x47].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x47].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x47].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x47].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x47].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x47].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x47].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x47].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x47].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x47].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x47].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x47].field_1.Value = pGVar3[0x47].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x47].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x47].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x47].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x47].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x47].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x47].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x47].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x47].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x47].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x47].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x47].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4d].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4d].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4d].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4d].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x4d].field_1.Value = pGVar3[0x4d].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4d].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4d].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4d].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4d].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x48].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x48].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x48].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x48].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x48].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x48].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x48].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x48].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x48].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x48].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x48].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x48].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x48].field_1.Value = pGVar3[0x48].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x48].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x48].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x48].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x48].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x48].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x48].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x48].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x48].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x48].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x48].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x48].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x49].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x49].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x49].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x49].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x49].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x49].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x49].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x49].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x49].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x49].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x49].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x49].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x49].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x49].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x49].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x49].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x49].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x49].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x49].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x49].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x49].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x49].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x49].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x49].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4a].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4a].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4a].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4a].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4b].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4b].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4b].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4b].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x4b].field_1.Value = pGVar3[0x4b].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4b].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4b].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4b].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4b].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4c].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4c].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4c].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4c].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x4c].field_1.Value = pGVar3[0x4c].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4c].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4c].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4c].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4c].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4e].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4e].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4e].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4e].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x4e].field_1.Value = pGVar3[0x4e].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4e].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4e].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4e].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x4e].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x50].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x50].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x50].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x50].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x50].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x50].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x50].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x50].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x50].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x50].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x50].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x50].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x50].field_1.Value = pGVar3[0x50].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x50].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x50].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x50].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x50].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x50].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x50].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x50].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x50].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x50].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x50].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x50].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x51].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x51].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x51].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x51].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x51].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x51].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x51].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x51].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x51].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x51].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x51].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x51].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x51].field_1.Value = pGVar3[0x51].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x51].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x51].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x51].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x51].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x51].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x51].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x51].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x51].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x51].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x51].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x51].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x52].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x52].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x52].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x52].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x52].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x52].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x52].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x52].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x52].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x52].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x52].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x52].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x52].field_1.Value = pGVar3[0x52].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x52].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x52].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x52].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x52].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x52].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x52].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x52].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x52].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x52].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x52].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x52].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x53].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x53].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x53].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x53].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x53].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x53].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x53].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x53].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x53].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x53].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x53].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x53].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x53].field_1.Value = pGVar3[0x53].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x53].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x53].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x53].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x53].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x53].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x53].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x53].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x53].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x53].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x53].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x53].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x54].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x54].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x54].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x54].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x54].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x54].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x54].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x54].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x54].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x54].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x54].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x54].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x54].field_1.Value = pGVar3[0x54].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x54].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x54].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x54].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x54].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x54].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x54].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x54].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x54].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x54].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x54].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x54].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x55].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x55].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x55].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x55].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x55].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x55].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x55].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x55].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x55].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x55].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x55].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x55].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x55].field_1.Value = pGVar3[0x55].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x55].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x55].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x55].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x55].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x55].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x55].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x55].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x55].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x55].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x55].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x55].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5d].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5d].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5d].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5d].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5d].field_1;
    paVar1->Value = paVar1->Value | 0x40000;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x5d].field_1.Value = pGVar3[0x5d].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5d].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5d].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5d].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5d].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x56].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x56].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x56].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x56].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x56].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x56].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x56].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x56].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x56].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x56].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x56].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x56].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x56].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x56].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x56].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x56].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x56].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x56].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x56].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x56].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x56].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x56].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x56].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x56].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x57].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x57].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x57].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x57].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x57].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x57].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x57].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x57].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x57].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x57].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x57].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x57].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x57].field_1.Value = pGVar3[0x57].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x57].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x57].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x57].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x57].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x57].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x57].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x57].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x57].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x57].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x57].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x57].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x58].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x58].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x58].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x58].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x58].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x58].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x58].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x58].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x58].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x58].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x58].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x58].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x58].field_1.Value = pGVar3[0x58].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x58].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x58].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x58].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x58].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x58].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x58].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x58].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x58].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x58].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x58].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x58].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x59].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x59].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x59].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x59].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x59].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x59].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x59].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x59].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x59].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x59].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x59].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x59].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x59].field_1.Value = pGVar3[0x59].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x59].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x59].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x59].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x59].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x59].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x59].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x59].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x59].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x59].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x59].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x59].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5a].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5a].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5a].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5a].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5a].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5b].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5b].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5b].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5b].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5b].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5b].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5c].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5c].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5c].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5c].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5e].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5e].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5e].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5e].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5f].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5f].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5f].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x5f].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x62].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x62].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x62].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x62].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x62].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x62].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x62].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x62].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x62].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x62].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x62].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x62].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x62].field_1.Value = pGVar3[0x62].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x62].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x62].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x62].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x62].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x62].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x62].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x62].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x62].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x62].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x62].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x62].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6d].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6d].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6d].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6d].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6e].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6e].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6e].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x6e].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x70].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x70].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x70].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x70].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x70].field_1.Value = pGVar3[0x70].field_1.Value & 0xffffffffffffffcf | 0x10;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x70].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x70].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x70].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x70].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x70].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x70].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x70].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x70].field_1.Value = pGVar3[0x70].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x70].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x70].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x70].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x70].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x70].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x70].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x70].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x70].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x70].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x70].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x70].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x71].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x71].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x71].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x71].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x71].field_1.Value = pGVar3[0x71].field_1.Value & 0xffffffffffffffcf | 0x10;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x71].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x71].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x71].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x71].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x71].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x71].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x71].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x71].field_1.Value = pGVar3[0x71].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x71].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x71].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x71].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x71].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x71].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x71].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x71].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x71].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x71].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x71].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x71].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x73].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x73].field_1.Value =
         pGVar3[0x73].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x73].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x73].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x73].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x73].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x73].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x73].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x73].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x73].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x73].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x73].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x73].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x73].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x73].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x73].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x73].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x73].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x73].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x73].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x73].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x73].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x73].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x73].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x75].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x75].field_1.Value =
         pGVar3[0x75].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x75].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x75].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x75].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x75].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x75].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x75].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x75].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x75].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x75].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x75].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x75].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x75].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x75].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x75].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x75].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x75].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x75].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x75].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x75].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x75].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x75].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x75].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x76].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x76].field_1.Value =
         pGVar3[0x76].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x76].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x76].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x76].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x76].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x76].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x76].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x76].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x76].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x76].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x76].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x76].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x76].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x76].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x76].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x76].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x76].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x76].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x76].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x76].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x76].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x76].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x76].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x77].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x77].field_1.Value =
         pGVar3[0x77].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x77].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x77].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x77].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x77].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x77].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x77].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x77].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x77].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x77].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x77].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x77].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x77].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x77].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x77].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x77].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x77].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x77].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x77].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x77].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x77].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x77].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x77].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x78].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x78].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x78].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x78].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x78].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x78].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x78].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x78].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x78].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x78].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x78].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x78].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x78].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x78].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x78].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x78].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x78].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x78].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x78].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x78].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x78].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x78].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x78].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x78].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x79].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x79].field_1.Value =
         pGVar3[0x79].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x79].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x79].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x79].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x79].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x79].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x79].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x79].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x79].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x79].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x79].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x79].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x79].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x79].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x79].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x79].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x79].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x79].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x79].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x79].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x79].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x79].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x79].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7a].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x7a].field_1.Value =
         pGVar3[0x7a].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7a].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7a].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7a].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7a].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7a].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7b].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x7b].field_1.Value =
         pGVar3[0x7b].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7b].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7b].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7b].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7b].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7b].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x7c].field_1.Value =
         pGVar3[0x7c].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7c].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7c].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7c].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7c].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x7d].field_1.Value =
         pGVar3[0x7d].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7d].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7d].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7d].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7d].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x7e].field_1.Value =
         pGVar3[0x7e].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7e].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7e].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7e].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7e].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x7f].field_1.Value =
         pGVar3[0x7f].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7f].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7f].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7f].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x7f].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x80].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x80].field_1.Value =
         pGVar3[0x80].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x80].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x80].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x80].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x80].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x80].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x80].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x80].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x80].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x80].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x80].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x80].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x80].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x80].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x80].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x80].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x80].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x80].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x80].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x80].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x80].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x80].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x80].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x81].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x81].field_1.Value =
         pGVar3[0x81].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x81].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x81].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x81].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x81].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x81].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x81].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x81].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x81].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x81].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x81].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x81].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x81].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x81].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x81].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x81].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x81].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x81].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x81].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x81].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x81].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x81].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x81].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x82].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x82].field_1.Value =
         pGVar3[0x82].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x82].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x82].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x82].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x82].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x82].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x82].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x82].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x82].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x82].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x82].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x82].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x82].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x82].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x82].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x82].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x82].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x82].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x82].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x82].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x82].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x82].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x82].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x83].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x83].field_1.Value =
         pGVar3[0x83].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x83].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x83].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x83].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x83].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x83].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x83].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x83].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x83].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x83].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x83].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x83].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x83].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x83].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x83].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x83].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x83].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x83].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x83].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x83].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x83].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x83].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x83].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x84].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x84].field_1.Value =
         pGVar3[0x84].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x84].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x84].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x84].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x84].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x84].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x84].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x84].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x84].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x84].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x84].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x84].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x84].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x84].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x84].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x84].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x84].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x84].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x84].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x84].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x84].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x84].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x84].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x85].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x85].field_1.Value =
         pGVar3[0x85].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x85].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x85].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x85].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x85].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x85].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x85].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x85].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x85].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x85].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x85].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x85].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x85].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x85].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x85].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x85].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x85].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x85].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x85].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x85].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x85].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x85].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x85].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x86].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x86].field_1.Value =
         pGVar3[0x86].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x86].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x86].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x86].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x86].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x86].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x86].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x86].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x86].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x86].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x86].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x86].field_1.Value = pGVar3[0x86].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x86].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x86].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x86].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x86].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x86].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x86].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x86].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x86].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x86].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x86].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x86].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x87].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x87].field_1.Value =
         pGVar3[0x87].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x87].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x87].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x87].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x87].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x87].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x87].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x87].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x87].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x87].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x87].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x87].field_1.Value = pGVar3[0x87].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x87].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x87].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x87].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x87].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x87].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x87].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x87].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x87].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x87].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x87].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x87].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x88].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x88].field_1.Value =
         pGVar3[0x88].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x88].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x88].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x88].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x88].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x88].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x88].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x88].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x88].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x88].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x88].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x88].field_1.Value = pGVar3[0x88].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x88].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x88].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x88].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x88].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x88].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x88].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x88].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x88].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x88].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x88].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x88].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x89].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x89].field_1.Value =
         pGVar3[0x89].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x89].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x89].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x89].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x89].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x89].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x89].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x89].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x89].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x89].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x89].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x89].field_1.Value = pGVar3[0x89].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x89].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x89].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x89].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x89].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x89].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x89].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x89].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x89].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x89].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x89].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x89].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8b].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x8b].field_1.Value =
         pGVar3[0x8b].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8b].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8b].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x8b].field_1.Value = pGVar3[0x8b].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8b].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8b].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8b].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8b].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8c].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x8c].field_1.Value =
         pGVar3[0x8c].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8c].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8c].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x8c].field_1.Value = pGVar3[0x8c].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8c].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8c].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8c].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8c].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8d].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x8d].field_1.Value =
         pGVar3[0x8d].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8d].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8d].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x8d].field_1.Value = pGVar3[0x8d].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8d].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8d].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8d].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8d].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8e].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x8e].field_1.Value =
         pGVar3[0x8e].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8e].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8e].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x8e].field_1.Value = pGVar3[0x8e].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8e].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8e].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8e].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8e].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8f].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x8f].field_1.Value =
         pGVar3[0x8f].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8f].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8f].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x8f].field_1.Value = pGVar3[0x8f].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8f].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8f].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8f].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x8f].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x90].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x90].field_1.Value =
         pGVar3[0x90].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x90].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x90].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x90].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x90].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x90].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x90].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x90].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x90].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x90].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x90].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x90].field_1.Value = pGVar3[0x90].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x90].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x90].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x90].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x90].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x90].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x90].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x90].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x90].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x90].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x90].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x90].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa1].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa1].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa1].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa1].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa1].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa1].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xa2].field_1.Value =
         pGVar3[0xa2].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa2].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa2].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa2].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa2].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x99].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x99].field_1.Value =
         pGVar3[0x99].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x99].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x99].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x99].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x99].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x99].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x99].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x99].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x99].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x99].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x99].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x99].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x99].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x99].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x99].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x99].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x99].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x99].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x99].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x99].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x99].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x99].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x99].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x9a].field_1.Value =
         pGVar3[0x9a].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9a].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9a].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9a].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9a].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x9b].field_1.Value =
         pGVar3[0x9b].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9b].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9b].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9b].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9b].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9c].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9c].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9c].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9c].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9d].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9d].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9d].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9d].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9d].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9e].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x9e].field_1.Value =
         pGVar3[0x9e].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9e].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9e].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9e].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9e].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9e].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9e].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9e].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9f].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x9f].field_1.Value =
         pGVar3[0x9f].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9f].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9f].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9f].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9f].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9f].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9f].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x9f].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa0].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xa0].field_1.Value =
         pGVar3[0xa0].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa0].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa0].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa0].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa0].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa0].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa4].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa4].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa4].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa4].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa5].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xa5].field_1.Value =
         pGVar3[0xa5].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa5].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa5].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa5].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa5].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa5].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa6].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa6].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa6].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa6].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xa7].field_1.Value =
         pGVar3[0xa7].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa7].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa7].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa7].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa7].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa8].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xa8].field_1.Value =
         pGVar3[0xa8].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa8].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa8].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa8].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa8].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa8].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb1].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb1].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb1].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb1].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xb2].field_1.Value =
         pGVar3[0xb2].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb2].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb2].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb2].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb2].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb3].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xb3].field_1.Value =
         pGVar3[0xb3].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb3].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb3].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb3].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb3].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb3].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb4].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xb4].field_1.Value =
         pGVar3[0xb4].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb4].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb4].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xb4].field_1.Value = pGVar3[0xb4].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb4].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb4].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb4].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb4].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x3c].field_1.Value =
         pGVar3[0x3c].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3c].field_1;
    paVar1->Value = paVar1->Value | 4;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x3c].field_1.Value =
         pGVar3[0x3c].field_1.Value & 0xfffffffffffffff7 |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 6 & 8)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x3c].field_1.Value =
         (pGVar3[0x3c].field_1.Value & 0xffffffffffffdfff) +
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 & 0x400)
         * 8;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3c].field_1;
    paVar1->Value = paVar1->Value | 0x180000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3c].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3c].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3c].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3c].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb5].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xb5].field_1.Value =
         pGVar3[0xb5].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb5].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb5].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xb5].field_1.Value = pGVar3[0xb5].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb5].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb5].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb5].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb5].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb6].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xb6].field_1.Value =
         pGVar3[0xb6].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb6].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb6].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xb6].field_1.Value = pGVar3[0xb6].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb6].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb6].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb6].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb6].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb7].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xb7].field_1.Value =
         pGVar3[0xb7].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb7].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb7].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xb7].field_1.Value = pGVar3[0xb7].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb7].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb7].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb7].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb7].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb8].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xb8].field_1.Value =
         pGVar3[0xb8].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb8].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb8].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xb8].field_1.Value = pGVar3[0xb8].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb8].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb8].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb8].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb8].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb9].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xb9].field_1.Value =
         pGVar3[0xb9].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb9].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb9].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xb9].field_1.Value = pGVar3[0xb9].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb9].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb9].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb9].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb9].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xba].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xba].field_1.Value =
         pGVar3[0xba].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xba].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xba].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xba].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xba].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xba].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xba].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xba].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xba].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xba].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xba].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xba].field_1.Value = pGVar3[0xba].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xba].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xba].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xba].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xba].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xba].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xba].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xba].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xba].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xba].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xba].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xba].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbb].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xbb].field_1.Value =
         pGVar3[0xbb].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbb].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbb].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xbb].field_1.Value = pGVar3[0xbb].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbb].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbb].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbb].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbb].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbc].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xbc].field_1.Value =
         pGVar3[0xbc].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbc].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbc].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xbc].field_1.Value = pGVar3[0xbc].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbc].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbc].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbc].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbc].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbd].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xbd].field_1.Value =
         pGVar3[0xbd].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbd].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbd].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xbd].field_1.Value = pGVar3[0xbd].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbd].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbd].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbd].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbd].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbe].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xbe].field_1.Value =
         pGVar3[0xbe].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbe].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbe].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbe].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbe].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbe].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbe].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbe].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbe].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbe].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbe].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xbe].field_1.Value = pGVar3[0xbe].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbe].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbe].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbe].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbe].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbe].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbe].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbe].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbe].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbe].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbe].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbe].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbf].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xbf].field_1.Value =
         pGVar3[0xbf].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbf].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbf].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xbf].field_1.Value = pGVar3[0xbf].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbf].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbf].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbf].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xbf].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc0].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xc0].field_1.Value =
         pGVar3[0xc0].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc0].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc0].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xc0].field_1.Value = pGVar3[0xc0].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc0].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc0].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc0].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc0].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc1].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xc1].field_1.Value =
         pGVar3[0xc1].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc1].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc1].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc1].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc1].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc1].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc2].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xc2].field_1.Value =
         pGVar3[0xc2].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc2].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc2].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc2].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc2].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc2].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc3].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xc3].field_1.Value =
         pGVar3[0xc3].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc3].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc3].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xc3].field_1.Value = pGVar3[0xc3].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc3].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc3].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc3].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc3].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc4].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xc4].field_1.Value =
         pGVar3[0xc4].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc4].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc4].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xc4].field_1.Value = pGVar3[0xc4].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc4].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc4].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc4].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc4].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc5].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xc5].field_1.Value =
         pGVar3[0xc5].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc5].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc5].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xc5].field_1.Value = pGVar3[0xc5].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc5].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc5].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc5].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc5].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc6].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc6].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc6].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc6].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[199].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[199].field_1.Value =
         pGVar3[199].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[199].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[199].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[199].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[199].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[199].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[199].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[199].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[199].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[199].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[199].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[199].field_1.Value = pGVar3[199].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[199].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[199].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[199].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[199].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[199].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[199].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[199].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[199].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[199].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[199].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[199].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[200].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[200].field_1.Value =
         pGVar3[200].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[200].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[200].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[200].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[200].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[200].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[200].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[200].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[200].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[200].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[200].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[200].field_1.Value = pGVar3[200].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[200].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[200].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[200].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[200].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[200].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[200].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[200].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[200].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[200].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[200].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[200].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc9].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xc9].field_1.Value =
         pGVar3[0xc9].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc9].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc9].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xc9].field_1.Value = pGVar3[0xc9].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc9].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc9].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc9].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xc9].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xca].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xca].field_1.Value =
         pGVar3[0xca].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xca].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xca].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xca].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xca].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xca].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xca].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xca].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xca].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xca].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xca].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xca].field_1.Value = pGVar3[0xca].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xca].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xca].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xca].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xca].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xca].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xca].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xca].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xca].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xca].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xca].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xca].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcb].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xcb].field_1.Value =
         pGVar3[0xcb].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcb].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcb].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xcb].field_1.Value = pGVar3[0xcb].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcb].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcb].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcb].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcb].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcc].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xcc].field_1.Value =
         pGVar3[0xcc].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcc].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcc].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xcc].field_1.Value = pGVar3[0xcc].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcc].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcc].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcc].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcc].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcd].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xcd].field_1.Value =
         pGVar3[0xcd].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcd].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcd].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcd].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcd].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcd].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xce].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xce].field_1.Value =
         pGVar3[0xce].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xce].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xce].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xce].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xce].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xce].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xce].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xce].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xce].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xce].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xce].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xce].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xce].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xce].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xce].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xce].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xce].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xce].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xce].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xce].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xce].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xce].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xce].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcf].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xcf].field_1.Value =
         pGVar3[0xcf].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcf].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcf].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcf].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcf].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xcf].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd0].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xd0].field_1.Value =
         pGVar3[0xd0].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd0].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd0].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd0].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd0].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd0].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd1].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xd1].field_1.Value =
         pGVar3[0xd1].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd1].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd1].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd1].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd1].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd1].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd2].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xd2].field_1.Value =
         pGVar3[0xd2].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd2].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd2].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd2].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd2].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd2].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd3].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xd3].field_1.Value =
         pGVar3[0xd3].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd3].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd3].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd3].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd3].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd3].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd4].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xd4].field_1.Value =
         pGVar3[0xd4].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd4].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd4].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xd4].field_1.Value = pGVar3[0xd4].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd4].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd4].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd4].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd4].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd5].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xd5].field_1.Value =
         pGVar3[0xd5].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd5].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd5].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xd5].field_1.Value = pGVar3[0xd5].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd5].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd5].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd5].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd5].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd6].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xd6].field_1.Value =
         pGVar3[0xd6].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd6].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd6].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd6].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd6].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd6].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd7].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xd7].field_1.Value =
         pGVar3[0xd7].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd7].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd7].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd7].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd7].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd7].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd8].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xd8].field_1.Value =
         pGVar3[0xd8].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd8].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd8].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd8].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd8].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd8].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd9].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xd9].field_1.Value =
         pGVar3[0xd9].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd9].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd9].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd9].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd9].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xd9].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xda].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xda].field_1.Value =
         pGVar3[0xda].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xda].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xda].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xda].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xda].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xda].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xda].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xda].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xda].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xda].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xda].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xda].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xda].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xda].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xda].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xda].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xda].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xda].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xda].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xda].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xda].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xda].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xda].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x91].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x91].field_1.Value =
         pGVar3[0x91].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x91].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x91].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x91].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x91].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x91].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x91].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x91].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x91].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x91].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x91].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x91].field_1.Value = pGVar3[0x91].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x91].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x91].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x91].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x91].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x91].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x91].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x91].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x91].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x91].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x91].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x91].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa9].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xa9].field_1.Value =
         pGVar3[0xa9].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa9].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa9].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xa9].field_1.Value = pGVar3[0xa9].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa9].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa9].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa9].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xa9].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaa].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xaa].field_1.Value =
         pGVar3[0xaa].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaa].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaa].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaa].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaa].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaa].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaa].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaa].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaa].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaa].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaa].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xaa].field_1.Value = pGVar3[0xaa].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaa].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaa].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaa].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaa].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaa].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaa].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaa].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaa].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaa].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaa].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaa].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xab].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xab].field_1.Value =
         pGVar3[0xab].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xab].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xab].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xab].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xab].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xab].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xab].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xab].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xab].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xab].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xab].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xab].field_1.Value = pGVar3[0xab].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xab].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xab].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xab].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xab].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xab].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xab].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xab].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xab].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xab].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xab].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xab].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xac].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xac].field_1.Value =
         pGVar3[0xac].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xac].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xac].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xac].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xac].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xac].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xac].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xac].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xac].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xac].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xac].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xac].field_1.Value = pGVar3[0xac].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xac].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xac].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xac].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xac].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xac].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xac].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xac].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xac].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xac].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xac].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xac].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xad].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xad].field_1.Value =
         pGVar3[0xad].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xad].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xad].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xad].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xad].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xad].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xad].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xad].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xad].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xad].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xad].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xad].field_1.Value = pGVar3[0xad].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xad].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xad].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xad].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xad].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xad].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xad].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xad].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xad].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xad].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xad].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xad].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x97].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x97].field_1.Value =
         pGVar3[0x97].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x97].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x97].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x97].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x97].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x97].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x97].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x97].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x97].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x97].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x97].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x97].field_1.Value = pGVar3[0x97].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x97].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x97].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x97].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x97].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x97].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x97].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x97].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x97].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x97].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x97].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x97].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xae].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xae].field_1.Value =
         pGVar3[0xae].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xae].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xae].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xae].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xae].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xae].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xae].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xae].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xae].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xae].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xae].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xae].field_1.Value = pGVar3[0xae].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xae].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xae].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xae].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xae].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xae].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xae].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xae].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xae].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xae].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xae].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xae].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaf].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xaf].field_1.Value =
         pGVar3[0xaf].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaf].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaf].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xaf].field_1.Value = pGVar3[0xaf].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaf].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaf].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaf].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xaf].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb0].field_1;
    paVar1->Value = paVar1->Value | 1;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xb0].field_1.Value =
         pGVar3[0xb0].field_1.Value & 0xfffffffffffffffd |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 8 & 2)
    ;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb0].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb0].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xb0].field_1.Value = pGVar3[0xb0].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb0].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb0].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb0].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xb0].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdc].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdc].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdc].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdc].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xdc].field_1.Value = pGVar3[0xdc].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdc].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdc].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdc].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdc].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdc].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdc].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdd].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdd].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdd].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdd].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdd].field_1;
    paVar1->Value = paVar1->Value | 0x40000;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xdd].field_1.Value = pGVar3[0xdd].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdd].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdd].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdd].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdd].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdd].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdd].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xde].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xde].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xde].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xde].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xde].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xde].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xde].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xde].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xde].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xde].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xde].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xde].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xde].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xde].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xde].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xde].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xde].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xde].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xde].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xde].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xde].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xde].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xde].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xde].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdf].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdf].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdf].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdf].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdf].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdf].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdf].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdf].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xdf].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe0].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe0].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe0].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe0].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xe0].field_1.Value = pGVar3[0xe0].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe0].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe0].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe0].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe0].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe1].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe1].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe1].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe1].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xe1].field_1.Value = pGVar3[0xe1].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe1].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe1].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe1].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe1].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe2].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe2].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe2].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe2].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe2].field_1;
    paVar1->Value = paVar1->Value | 0x40000;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xe2].field_1.Value = pGVar3[0xe2].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe2].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe2].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe2].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe2].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe3].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe3].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe3].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe3].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xe3].field_1.Value = pGVar3[0xe3].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe3].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe3].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe3].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe3].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe4].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe4].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe4].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe4].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xe4].field_1.Value = pGVar3[0xe4].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe4].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe4].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe4].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe4].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe4].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe4].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe5].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe5].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe5].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe5].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xe5].field_1.Value = pGVar3[0xe5].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe5].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe5].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe5].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe5].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe5].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe5].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe6].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe6].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe6].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe6].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xe6].field_1.Value = pGVar3[0xe6].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe6].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe6].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe6].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe6].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe6].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe6].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe7].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe7].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe7].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe7].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xe7].field_1.Value = pGVar3[0xe7].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe7].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe7].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe7].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe7].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe7].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe7].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe8].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe8].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe8].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe8].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe8].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe8].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe8].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe8].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe8].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe9].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe9].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe9].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe9].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xe9].field_1.Value = pGVar3[0xe9].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe9].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe9].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe9].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe9].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe9].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xe9].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xea].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xea].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xea].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xea].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xea].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xea].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xea].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xea].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xea].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xea].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xea].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xea].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xea].field_1.Value = pGVar3[0xea].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xea].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xea].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xea].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xea].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xea].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xea].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xea].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xea].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xea].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xea].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xea].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xeb].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xeb].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xeb].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xeb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xeb].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xeb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xeb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xeb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xeb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xeb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xeb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xeb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xeb].field_1.Value = pGVar3[0xeb].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xeb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xeb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xeb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xeb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xeb].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xeb].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xeb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xeb].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xeb].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xeb].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xeb].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xed].field_1;
    paVar1->Value = paVar1->Value | 1;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xed].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xed].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xed].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xed].field_1;
    paVar1->Value = paVar1->Value | 0x30;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xed].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xed].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xed].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xed].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xed].field_1;
    paVar1->Value = paVar1->Value | 0x30000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xed].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xed].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xed].field_1.Value = pGVar3[0xed].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xed].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xed].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xed].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xed].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xed].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xed].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xed].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xed].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xed].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xed].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xed].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf0].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf0].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf0].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf0].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf0].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf0].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf1].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf1].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf1].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf1].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf1].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf1].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf2].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf2].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf2].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf2].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf2].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf2].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xf3].field_1.Value =
         pGVar3[0xf3].field_1.Value & 0xfffffffffffffffe |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 0x16 &
                1);
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0xf3].field_1.Value =
         pGVar3[0xf3].field_1.Value & 0xffffffffffffffcf |
         (ulong)(*(uint *)&(((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1 >> 0x12 &
                0x10);
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf3].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf3].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf3].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf3].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf3].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0xf3].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x118].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x118].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x118].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x118].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x118].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x118].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x118].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x118].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x118].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x118].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x118].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x118].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x118].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x118].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x118].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x118].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x118].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x118].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x118].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x118].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x118].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x118].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x118].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x118].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x119].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x119].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x119].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x119].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x119].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x119].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x119].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x119].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x119].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x119].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x119].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x119].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x119].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x119].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x119].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x119].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x119].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x119].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x119].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x119].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x119].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x119].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x119].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x119].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11a].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11a].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11a].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11a].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11a].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11b].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11b].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11b].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11b].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11b].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11b].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11c].field_1;
    paVar1->Value = paVar1->Value | 2;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11c].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
    pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar3[0x11c].field_1.Value = pGVar3[0x11c].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11c].field_1;
    paVar1->Value = paVar1->Value | 0x20000000;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11c].field_1;
    paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11c].field_1;
    paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11c].field_1;
    paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11c].field_1;
    paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x11c].field_1;
    paVar1->Value = paVar1->Value & 0xffefffffffffffff;
    PTEValue = (uint64_t)
               &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy
                .super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pGmmLibContext;
    SetUpMOCSTable(this);
    lVar19 = 0;
    do {
      local_31[0] = false;
      local_48 = 0;
      uVar11 = IsSpecialMOCSUsage(this,(GMM_RESOURCE_USAGE_TYPE)lVar19,local_31);
      pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
      uVar12 = pGVar3[lVar19].field_1.Value;
      uVar17 = (uint)uVar12;
      uVar14 = 0;
      if ((uVar17 >> 0xd & 1) != 0) {
        uVar14 = (*(uint *)(*(long *)PTEValue + 0x1c) & 0x400) << 4;
      }
      uVar15 = uVar17 * 2;
      uVar18 = uVar15 & 0x18000;
      if ((uVar12 & 0xc000) == 0) {
        uVar18 = 0;
      }
      uVar14 = uVar18 | (int)(uVar17 << 0xf) >> 0x1f & uVar15 & 0x60000 | uVar14;
      uVar15 = (uVar15 & 0x700) + 0x80 + uVar14;
      if ((uVar12 & 0x380) == 0) {
        uVar15 = uVar14;
      }
      uVar7 = (ushort)uVar12 & 4;
      sVar13 = ((ushort)(uVar12 >> 9) & 0xe) + 0x11 + uVar7 * 8;
      if ((uVar12 & 0x1c00) == 0) {
        sVar13 = uVar7 * 8 + 0x10;
      }
      if ((int)uVar11 < 0x3c) {
        iVar16 = uVar15 + 5 + (uVar17 & 0x30) + (uVar17 & 1) * 2;
        if ((uVar17 >> 0x12 & 1) == 0) {
          uVar14 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                   super_GmmGen9CachePolicy.CurrentMaxMocsIndex;
          if (uVar14 != 0) {
            lVar4 = *(long *)PTEValue;
            uVar17 = 2;
            do {
              uVar12 = (ulong)(uVar17 - 1);
              if (((*(int *)(lVar4 + 0x33e0 + uVar12 * 8) == iVar16) &&
                  (*(short *)(lVar4 + 0x33e4 + uVar12 * 8) == sVar13)) &&
                 (*(char *)(lVar4 + 0x33e6 + uVar12 * 8) == '\0')) {
                bVar6 = true;
                uVar11 = uVar17 - 1;
              }
              else {
                bVar6 = false;
              }
            } while ((!bVar6) && (bVar6 = uVar17 <= uVar14, uVar17 = uVar17 + 1, bVar6));
          }
        }
        else {
          uVar14 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                   super_GmmGen9CachePolicy.CurrentMaxL1HdcMocsIndex;
          if (0x2f < uVar14) {
            lVar4 = *(long *)PTEValue;
            uVar17 = 0x31;
            do {
              uVar12 = (ulong)(uVar17 - 1);
              if (((*(int *)(lVar4 + 0x33e0 + uVar12 * 8) != iVar16) ||
                  (*(short *)(lVar4 + 0x33e4 + uVar12 * 8) != sVar13)) ||
                 (bVar6 = true, uVar15 = uVar17 - 1,
                 *(char *)(lVar4 + 0x33e6 + uVar12 * 8) != '\x01')) {
                bVar6 = false;
                uVar15 = uVar11;
              }
              uVar11 = uVar15;
            } while ((!bVar6) && (bVar6 = uVar17 <= uVar14, uVar17 = uVar17 + 1, bVar6));
          }
        }
      }
      uVar2 = pGVar3[lVar19].Override;
      uVar5 = pGVar3[lVar19].IsOverridenByRegkey;
      CachePolicyUsage.PTE.field_4.HighDwordValue = uVar5;
      CachePolicyUsage.PTE.field_4.DwordValue = uVar2;
      pGVar10 = pGVar3 + lVar19;
      uVar8 = pGVar10->MemoryObjectOverride;
      uVar9 = pGVar10->field_3;
      CachePolicyUsage.field_1.Value._4_4_ = uVar9;
      CachePolicyUsage.field_1.Value._0_4_ = uVar8;
      CachePolicyUsage._0_8_ = pGVar3[lVar19].field_1.Value;
      CachePolicyUsage._16_8_ = *(GMM_PTE_CACHE_CONTROL_BITS *)(&pGVar10->MemoryObjectOverride + 2);
      CachePolicyUsage.Override = (int)in_stack_ffffffffffffffb0;
      CachePolicyUsage.IsOverridenByRegkey = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
      GmmGen8CachePolicy::GetUsagePTEValue
                ((GmmGen8CachePolicy *)this,CachePolicyUsage,(GMM_RESOURCE_USAGE_TYPE)lVar19,
                 &local_48);
      (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[lVar19].PTE.field_4.
      DwordValue = (uint32_t)local_48;
      (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[lVar19].PTE.field_4.
      HighDwordValue = 0;
      pGVar3 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
      uVar14 = uVar11 * 2 & 0x7e;
      if (uVar11 == 0xffffffff) {
        uVar14 = 6;
      }
      pGVar3[lVar19].MemoryObjectOverride.DwordValue =
           pGVar3[lVar19].MemoryObjectOverride.DwordValue & 0xffffff81 | uVar14;
      (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[lVar19].Override = 0xffffffff
      ;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 0x11e);
    return GMM_SUCCESS;
  }
  return GMM_ERROR;
}

Assistant:

GMM_STATUS GmmLib::GmmGen12CachePolicy::InitCachePolicy()
{

    __GMM_ASSERTPTR(pCachePolicy, GMM_ERROR);

#define DEFINE_CACHE_ELEMENT(usage, llc, ellc, l3, wt, age, aom, lecc_scc, l3_scc, scf, sso, cos, hdcl1, l3evict) DEFINE_CP_ELEMENT(usage, llc, ellc, l3, wt, age, aom, lecc_scc, l3_scc, scf, sso, cos, hdcl1, l3evict, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0)

#include "GmmGen12CachePolicy.h"

#define TC_LLC (1)
#define TC_ELLC (0)
#define TC_LLC_ELLC (2)

#define LeCC_UNCACHEABLE (0x0)
#define LeCC_WC_UNCACHEABLE (0x1)
#define LeCC_WT_CACHEABLE (0x2) //Only used as MemPushWRite disqualifier if set along with eLLC-only -still holds on gen12+?
#define LeCC_WB_CACHEABLE (0x3)

#define L3_UNCACHEABLE (0x1)
#define L3_WB_CACHEABLE (0x3)

#define DISABLE_SKIP_CACHING_CONTROL (0x0)
#define ENABLE_SKIP_CACHING_CONTROL (0x1)

#define DISABLE_SELF_SNOOP_OVERRIDE (0x0)
#define ENABLE_SELF_SNOOP_OVERRIDE (0x1)
#define ENABLE_SELF_SNOOP_ALWAYS (0x3)
#define CLASS_SERVICE_ZERO (0x0)

    {
        SetUpMOCSTable();
    }

    {
        // Define index of cache element
        uint32_t Usage = 0;

#if(_WIN32 && (_DEBUG || _RELEASE_INTERNAL))
        void *pKmdGmmContext = NULL;

        OverrideCachePolicy(pKmdGmmContext);
#endif
        // Process the cache policy and fill in the look up table
        for(; Usage < GMM_RESOURCE_USAGE_MAX; Usage++)
        {
            bool                         CachePolicyError = false;
            bool                         SpecialMOCS      = false;
            int32_t                      CPTblIdx         = -1;
            uint32_t                     j                = 0;
            uint64_t                     PTEValue         = 0;
            GMM_CACHE_POLICY_TBL_ELEMENT UsageEle         = {0};

            CPTblIdx = IsSpecialMOCSUsage((GMM_RESOURCE_USAGE_TYPE)Usage, SpecialMOCS);

            UsageEle.LeCC.Reserved = 0; // Reserved bits zeroe'd, this is so we
                                        // we can compare the unioned LeCC.DwordValue.
            UsageEle.LeCC.SelfSnoop = DISABLE_SELF_SNOOP_OVERRIDE;
            UsageEle.LeCC.CoS       = CLASS_SERVICE_ZERO;
            UsageEle.LeCC.SCC       = 0;
            UsageEle.LeCC.ESC       = 0;

            if(pCachePolicy[Usage].SCF && pGmmLibContext->GetSkuTable().FtrLLCBypass)
            {
                UsageEle.LeCC.SCF = pCachePolicy[Usage].SCF;
                __GMM_ASSERT(pCachePolicy[Usage].LLC == 0); //LLC and ByPassLLC are mutually-exclusive
            }

            if(pCachePolicy[Usage].SSO & ENABLE_SELF_SNOOP_OVERRIDE)
            {
                UsageEle.LeCC.SelfSnoop = pCachePolicy[Usage].SSO & ENABLE_SELF_SNOOP_ALWAYS;
            }
            if(pCachePolicy[Usage].CoS)
            {
                UsageEle.LeCC.CoS = pCachePolicy[Usage].CoS;
            }
            if(pCachePolicy[Usage].HDCL1)
            {
                UsageEle.HDCL1 = 1;
            }
            if(pCachePolicy[Usage].LeCC_SCC)
            {
                UsageEle.LeCC.SCC = pCachePolicy[Usage].LeCC_SCC;
                UsageEle.LeCC.ESC = ENABLE_SKIP_CACHING_CONTROL;
            }
            UsageEle.LeCC.LRUM = pCachePolicy[Usage].AGE;

            // default to LLC target cache.
            UsageEle.LeCC.TargetCache  = TC_LLC;
            UsageEle.LeCC.Cacheability = LeCC_WB_CACHEABLE;
            if(pCachePolicy[Usage].LLC)
            {
                UsageEle.LeCC.TargetCache = TC_LLC;
                __GMM_ASSERT(pCachePolicy[Usage].SCF == 0); //LLC and ByPassLLC are mutually-exclusive
            }
            else
            {
                UsageEle.LeCC.Cacheability = LeCC_WC_UNCACHEABLE;
            }
            UsageEle.L3.Reserved = 0; // Reserved bits zeroe'd, this is so we
                                      // we can compare the unioned L3.UshortValue.
            UsageEle.L3.ESC          = DISABLE_SKIP_CACHING_CONTROL;
            UsageEle.L3.SCC          = 0;
            UsageEle.L3.Cacheability = pCachePolicy[Usage].L3 ? L3_WB_CACHEABLE : L3_UNCACHEABLE;

            __GMM_ASSERT((pCachePolicy[Usage].L3 && pCachePolicy[Usage].L3Eviction != 0) ||
                         (pCachePolicy[Usage].L3 == 0 && (pCachePolicy[Usage].L3Eviction == 0 || Usage == GMM_RESOURCE_USAGE_L3_EVICTION)));

            if(pCachePolicy[Usage].L3_SCC)
            {
                UsageEle.L3.ESC = ENABLE_SKIP_CACHING_CONTROL;
                UsageEle.L3.SCC = (uint16_t)pCachePolicy[Usage].L3_SCC;
            }

            //Special-case MOCS handling for MOCS Table Index 60-63
            if(CPTblIdx >= GMM_GEN12_MAX_NUMBER_MOCS_INDEXES)
            {
                GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &pGmmLibContext->GetCachePolicyTlbElement()[CPTblIdx];

                if(SpecialMOCS &&
                   !(TblEle->LeCC.DwordValue == UsageEle.LeCC.DwordValue &&
                     TblEle->L3.UshortValue == UsageEle.L3.UshortValue &&
                     TblEle->HDCL1 == UsageEle.HDCL1))
                {
                    //Assert if being overwritten!
                    __GMM_ASSERT(TblEle->LeCC.DwordValue == 0 &&
                                 TblEle->L3.UshortValue == 0 &&
                                 TblEle->HDCL1 == 0);

#if(_WIN32 && (_DEBUG || _RELEASE_INTERNAL))
                    if(pCachePolicy[Usage].IsOverridenByRegkey)
                    {
                        TblEle->LeCC.DwordValue = UsageEle.LeCC.DwordValue;
                        TblEle->L3.UshortValue  = UsageEle.L3.UshortValue;
                        TblEle->HDCL1           = UsageEle.HDCL1;
                    }
#endif
                }
            }
            //For HDC L1 caching, MOCS Table index 48-59 should be used
            else if(UsageEle.HDCL1)
            {
                for(j = GMM_GEN10_HDCL1_MOCS_INDEX_START; j <= CurrentMaxL1HdcMocsIndex; j++)
                {
                    GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &pGmmLibContext->GetCachePolicyTlbElement()[j];
                    if(TblEle->LeCC.DwordValue == UsageEle.LeCC.DwordValue &&
                       TblEle->L3.UshortValue == UsageEle.L3.UshortValue &&
                       TblEle->HDCL1 == UsageEle.HDCL1)
                    {
                        CPTblIdx = j;
                        break;
                    }
                }
            }
            else
            {
                // Due to unstable system behavior on TGLLP, MOCS #0 index had to be programmed as UC in MOCS lookup table - pCachePolicyTlbElement
                // But still Index 0 is Reserved for Error by HW and should not be used.
                // Hence Gmmlib will opt out from the MOCS#0 usage and Lookup into MOCS table and MOCS index assigment must start from Index 1.
                for(j = 1; j <= CurrentMaxMocsIndex; j++)
                {
                    GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &pGmmLibContext->GetCachePolicyTlbElement()[j];
                    if(TblEle->LeCC.DwordValue == UsageEle.LeCC.DwordValue &&
                       TblEle->L3.UshortValue == UsageEle.L3.UshortValue &&
                       TblEle->HDCL1 == UsageEle.HDCL1)
                    {
                        CPTblIdx = j;
                        break;
                    }
                }
            }

            // Didn't find the caching settings in one of the already programmed lookup table entries.
            // Need to add a new lookup table entry.
            if(CPTblIdx == -1)
            {

#if(_WIN32 && (_DEBUG || _RELEASE_INTERNAL))
                // If the Cache Policy setting is overriden through regkey,
                // don't raise an assert/log error. Raising an assert for debug/perf testing isn't really helpful
                if(pCachePolicy[Usage].IsOverridenByRegkey)
                {
                    if(UsageEle.HDCL1 && CurrentMaxL1HdcMocsIndex < GMM_GEN12_MAX_NUMBER_MOCS_INDEXES - 1)
                    {
                        GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &(pGmmLibContext->GetCachePolicyTlbElement()[++CurrentMaxL1HdcMocsIndex]);
                        CPTblIdx                             = CurrentMaxL1HdcMocsIndex;

                        TblEle->LeCC.DwordValue = UsageEle.LeCC.DwordValue;
                        TblEle->L3.UshortValue  = UsageEle.L3.UshortValue;
                        TblEle->HDCL1           = UsageEle.HDCL1;
                    }
                    else if(CurrentMaxMocsIndex < GMM_GEN10_HDCL1_MOCS_INDEX_START)
                    {
                        GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &(pGmmLibContext->GetCachePolicyTlbElement()[++CurrentMaxMocsIndex]);
                        CPTblIdx                             = CurrentMaxMocsIndex;

                        TblEle->LeCC.DwordValue = UsageEle.LeCC.DwordValue;
                        TblEle->L3.UshortValue  = UsageEle.L3.UshortValue;
                        TblEle->HDCL1           = UsageEle.HDCL1;
                    }
                    else
                    {
                        // Too many unique caching combinations to program the
                        // MOCS lookup table.
                        CachePolicyError = true;
                        GMM_ASSERTDPF(
                        "Cache Policy Init Error: Invalid Cache Programming, too many unique caching combinations"
                        "(we only support GMM_GEN_MAX_NUMBER_MOCS_INDEXES = %d)",
                        GMM_MAX_NUMBER_MOCS_INDEXES - 1);
                        // Set cache policy index to uncached.
                        CPTblIdx = 3;
                    }
                }
                else
#endif
                {
                    GMM_ASSERTDPF(false, "CRITICAL ERROR: Cache Policy Usage value specified by Client is not defined in Fixed MOCS Table!");

                    CachePolicyError = true;
                    GMM_ASSERTDPF(
                    "Cache Policy Init Error: Invalid Cache Programming, too many unique caching combinations"
                    "(we only support GMM_GEN_MAX_NUMBER_MOCS_INDEXES = %d)",
                    CurrentMaxMocsIndex);

                    // Set cache policy index to uncached.
                    CPTblIdx = 3;
                }
            }

            // PTE entries do not control caching on SKL+ (for legacy context)
            if(!GetUsagePTEValue(pCachePolicy[Usage], Usage, &PTEValue))
            {
                CachePolicyError = true;
            }

            pCachePolicy[Usage].PTE.DwordValue     = PTEValue & 0xFFFFFFFF;
            pCachePolicy[Usage].PTE.HighDwordValue = 0;

            pCachePolicy[Usage].MemoryObjectOverride.Gen12.Index = CPTblIdx;

            pCachePolicy[Usage].Override = ALWAYS_OVERRIDE;

            if(CachePolicyError)
            {
                GMM_ASSERTDPF("Cache Policy Init Error: Invalid Cache Programming - Element %d", Usage);
            }
        }
    }

    return GMM_SUCCESS;
}